

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O1

void __thiscall
cpptrace::stacktrace::print
          (stacktrace *this,ostream *stream,bool color,bool newline_at_end,char *header)

{
  pointer psVar1;
  uint frame_number_width;
  size_t sVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  char *__s;
  stacktrace_frame *frame;
  pointer psVar3;
  size_t counter;
  char local_3e [2];
  undefined4 local_3c;
  stacktrace *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,newline_at_end);
  if ((int)CONCAT71(in_register_00000011,color) != 0) {
    if (stream == (ostream *)&std::cout) {
      ::isatty(stdout_fileno);
    }
    else if (stream == (ostream *)&std::cerr) {
      ::isatty(stderr_fileno);
    }
  }
  __s = "Stack trace (most recent call first):";
  if (header != (char *)0x0) {
    __s = header;
  }
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
  local_3e[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_3e + 1,1);
  psVar3 = (this->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 == psVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"<empty trace>\n",0xe);
  }
  else {
    frame_number_width =
         detail::n_digits((int)((ulong)((long)psVar1 - (long)psVar3) >> 5) * -0x55555555 - 1);
    psVar3 = (this->frames).
             super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->frames).
             super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar3 != psVar1) {
      counter = 0;
      local_38 = this;
      do {
        print_frame(stream,color,frame_number_width,counter,psVar3);
        if (((char)local_3c != '\0') ||
           (psVar3 != (local_38->frames).
                      super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1)) {
          local_3e[0] = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(stream,local_3e,1);
        }
        counter = counter + 1;
        psVar3 = psVar3 + 1;
      } while (psVar3 != psVar1);
    }
  }
  return;
}

Assistant:

void stacktrace::print(std::ostream& stream, bool color, bool newline_at_end, const char* header) const {
        if(
            color && (
                (&stream == &std::cout && isatty(stdout_fileno)) || (&stream == &std::cerr && isatty(stderr_fileno))
            )
        ) {
            detail::enable_virtual_terminal_processing_if_needed();
        }
        stream << (header ? header : "Stack trace (most recent call first):") << '\n';
        std::size_t counter = 0;
        if(frames.empty()) {
            stream << "<empty trace>\n";
            return;
        }
        const auto frame_number_width = detail::n_digits(static_cast<int>(frames.size()) - 1);
        for(const auto& frame : frames) {
            print_frame(stream, color, frame_number_width, counter, frame);
            if(newline_at_end || &frame != &frames.back()) {
                stream << '\n';
            }
            counter++;
        }
    }